

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

bool __thiscall QXmlStreamReaderPrivate::scanAttType(QXmlStreamReaderPrivate *this)

{
  bool bVar1;
  uint uVar2;
  QXmlStreamReaderPrivate *in_RDI;
  undefined1 unaff_retaddr;
  short unaff_retaddr_00;
  char *in_stack_00000008;
  QXmlStreamReaderPrivate *in_stack_00000010;
  bool local_1;
  
  uVar2 = peekChar(in_RDI);
  switch(uVar2) {
  case 0x43:
    local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    break;
  default:
    local_1 = false;
    break;
  case 0x45:
    bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    if (bVar1) {
      local_1 = true;
    }
    else {
      local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr)
      ;
    }
    break;
  case 0x49:
    bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    if (bVar1) {
      local_1 = true;
    }
    else {
      bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,
                             (bool)unaff_retaddr);
      }
    }
    break;
  case 0x4e:
    bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
    if (bVar1) {
      local_1 = true;
    }
    else {
      bVar1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,(bool)unaff_retaddr);
      if (bVar1) {
        local_1 = true;
      }
      else {
        local_1 = scanString(in_stack_00000010,in_stack_00000008,unaff_retaddr_00,
                             (bool)unaff_retaddr);
      }
    }
  }
  return local_1;
}

Assistant:

bool QXmlStreamReaderPrivate::scanAttType()
{
    switch (peekChar()) {
    case 'C':
        return scanString(spell[CDATA], CDATA);
    case 'I':
        if (scanString(spell[ID], ID))
            return true;
        if (scanString(spell[IDREF], IDREF))
            return true;
        return scanString(spell[IDREFS], IDREFS);
    case 'E':
        if (scanString(spell[ENTITY], ENTITY))
            return true;
        return scanString(spell[ENTITIES], ENTITIES);
    case 'N':
        if (scanString(spell[NOTATION], NOTATION))
            return true;
        if (scanString(spell[NMTOKEN], NMTOKEN))
            return true;
        return scanString(spell[NMTOKENS], NMTOKENS);
    default:
        ;
    }
    return false;
}